

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::IsPlanar(ON_NurbsSurface *this,ON_Plane *plane,double tolerance)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int j;
  ON_Plane *pOVar4;
  ON_3dVector *this_00;
  int i;
  byte bVar5;
  double dVar6;
  double dVar7;
  ON_3dVector local_160;
  ON_Plane local_148;
  ON_3dVector normal;
  ON_Interval vdom;
  ON_Interval udom;
  ON_3dVector dv;
  ON_3dVector du;
  ON_3dPoint center;
  ON_3dPoint cv;
  
  bVar5 = 0;
  ON_Plane::ON_Plane(&local_148);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,1);
  dVar6 = ON_Interval::ParameterAt(&udom,0.5);
  dVar7 = ON_Interval::ParameterAt(&vdom,0.5);
  bVar1 = ON_Surface::EvNormal
                    (&this->super_ON_Surface,dVar6,dVar7,&center,&du,&dv,&normal,0,(int *)0x0);
  if (bVar1) {
    dVar6 = ON_3dVector::Length(&normal);
    if (dVar6 < 0.9) {
      bVar1 = false;
      goto LAB_00556c72;
    }
  }
  local_148.origin.z = center.z;
  local_148.origin.x = center.x;
  local_148.origin.y = center.y;
  local_148.zaxis.x = normal.x;
  local_148.zaxis.y = normal.y;
  local_148.zaxis.z = normal.z;
  bVar2 = ON_3dVector::Unitize(&du);
  if (bVar2) {
    local_148.xaxis.z = du.z;
    local_148.xaxis.x = du.x;
    local_148.xaxis.y = du.y;
    ON_CrossProduct(&local_160,&local_148.zaxis,&local_148.xaxis);
    this_00 = &local_148.yaxis;
    local_148.yaxis.z = local_160.z;
    local_148.yaxis.x = local_160.x;
    local_148.yaxis.y = local_160.y;
LAB_00556a0d:
    ON_3dVector::Unitize(this_00);
    ON_Plane::UpdateEquation(&local_148);
  }
  else {
    bVar2 = ON_3dVector::Unitize(&dv);
    if (bVar2) {
      local_148.yaxis.z = dv.z;
      local_148.yaxis.x = dv.x;
      local_148.yaxis.y = dv.y;
      ON_CrossProduct(&local_160,&local_148.yaxis,&local_148.zaxis);
      this_00 = &local_148.xaxis;
      local_148.xaxis.z = local_160.z;
      local_148.xaxis.x = local_160.x;
      local_148.xaxis.y = local_160.y;
      goto LAB_00556a0d;
    }
    ON_Plane::CreateFromNormal(&local_148,&center,&normal);
  }
  dVar7 = ABS(local_148.zaxis.x);
  dVar6 = ABS(local_148.zaxis.y);
  if (((2.3283064365386963e-10 < dVar7) || (2.3283064365386963e-10 < dVar6)) ||
     (1.490116119385e-08 < ABS(ABS(local_148.zaxis.z) + -1.0))) {
    if (((dVar6 <= 2.3283064365386963e-10) && (ABS(local_148.zaxis.z) <= 2.3283064365386963e-10)) &&
       (ABS(dVar7 + -1.0) <= 1.490116119385e-08)) {
      local_148.xaxis.x = 0.0;
      local_148.yaxis.x = 0.0;
      local_148.zaxis.x = *(double *)(&DAT_006924c0 + (ulong)(local_148.zaxis.x < 0.0) * 8);
      local_148.zaxis.y = 0.0;
      local_148.zaxis.z = 0.0;
      goto LAB_00556bd8;
    }
    if (((dVar7 <= 2.3283064365386963e-10) && (ABS(local_148.zaxis.z) <= 2.3283064365386963e-10)) &&
       (ABS(dVar6 + -1.0) <= 1.490116119385e-08)) {
      local_148.xaxis.y = 0.0;
      local_148.yaxis.y = 0.0;
      local_148.zaxis.z = 0.0;
      local_148.zaxis.x = 0.0;
      local_148.zaxis.y = *(double *)(&DAT_006924c0 + (ulong)(local_148.zaxis.y < 0.0) * 8);
      goto LAB_00556bd8;
    }
  }
  else {
    local_148.xaxis.z = 0.0;
    local_148.zaxis.z = *(double *)(&DAT_006924c0 + (ulong)(local_148.zaxis.z < 0.0) * 8);
    local_148.yaxis.z = 0.0;
    local_148.zaxis.x = 0.0;
    local_148.zaxis.y = 0.0;
LAB_00556bd8:
    ON_Plane::UpdateEquation(&local_148);
  }
  i = 0;
  while ((i < this->m_cv_count[0] && (bVar1 != false))) {
    j = 0;
    while ((j < this->m_cv_count[1] && (bVar1 != false))) {
      GetCV(this,i,j,&cv);
      dVar6 = ON_Plane::DistanceTo(&local_148,&cv);
      if (tolerance < ABS(dVar6)) {
        bVar1 = false;
      }
      j = j + 1;
    }
    i = i + 1;
  }
  if ((plane != (ON_Plane *)0x0) && (bVar1 != false)) {
    pOVar4 = &local_148;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      (plane->origin).x = (pOVar4->origin).x;
      pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      plane = (ON_Plane *)((long)plane + (ulong)bVar5 * -0x10 + 8);
    }
    bVar1 = true;
  }
LAB_00556c72:
  ON_Plane::~ON_Plane(&local_148);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::IsPlanar(
      ON_Plane* plane,
      double tolerance
      ) const
{
  ON_Plane pln;
  double d;
  ON_3dPoint center, cv;
  ON_3dVector normal, du, dv;
  ON_Interval udom = Domain(0);
  ON_Interval vdom = Domain(1);
  bool rc = EvNormal( udom.ParameterAt(0.5), vdom.ParameterAt(0.5), center, du, dv, normal );
  if ( rc && normal.Length() < 0.9 )
    rc = false;
  else
  {
    pln.origin = center;
    pln.zaxis = normal;
    if ( du.Unitize() )
    {
      pln.xaxis = du;
      pln.yaxis = ON_CrossProduct( pln.zaxis, pln.xaxis );
      pln.yaxis.Unitize();
      pln.UpdateEquation();
    }
    else if ( dv.Unitize() )
    {
      pln.yaxis = dv;
      pln.xaxis = ON_CrossProduct( pln.yaxis, pln.zaxis );
      pln.xaxis.Unitize();
      pln.UpdateEquation();
    }
    else
    {
      pln.CreateFromNormal( center, normal );
    }

    // 7 July 2006 Dale Lear
    //    Add a slight bias for coordinate axes planes.
    //    This appears to do more good than harm.  The
    //    issue is keeping customers from getting alarmed
    //    when a coordinate they know is "zero" turns out to
    //    be 1e-23.
    if (    fabs(pln.zaxis.x) <= ON_ZERO_TOLERANCE 
         && fabs(pln.zaxis.y) <= ON_ZERO_TOLERANCE
         && fabs(fabs(pln.zaxis.z)-1.0) <= ON_SQRT_EPSILON
       )
    {
      pln.xaxis.z = 0.0;
      pln.yaxis.z = 0.0;
      pln.zaxis.x = 0.0;
      pln.zaxis.y = 0.0;
      pln.zaxis.z = (pln.zaxis.z<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }
    else if (    fabs(pln.zaxis.y) <= ON_ZERO_TOLERANCE 
              && fabs(pln.zaxis.z) <= ON_ZERO_TOLERANCE
              && fabs(fabs(pln.zaxis.x)-1.0) <= ON_SQRT_EPSILON
            )
    {
      pln.xaxis.x = 0.0;
      pln.yaxis.x = 0.0;
      pln.zaxis.y = 0.0;
      pln.zaxis.z = 0.0;
      pln.zaxis.x = (pln.zaxis.x<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }
    else if (    fabs(pln.zaxis.z) <= ON_ZERO_TOLERANCE 
              && fabs(pln.zaxis.x) <= ON_ZERO_TOLERANCE
              && fabs(fabs(pln.zaxis.y)-1.0) <= ON_SQRT_EPSILON
            )
    {
      pln.xaxis.y = 0.0;
      pln.yaxis.y = 0.0;
      pln.zaxis.z = 0.0;
      pln.zaxis.x = 0.0;
      pln.zaxis.y = (pln.zaxis.y<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }

    int i, j;
    for ( i = 0; i < m_cv_count[0] && rc; i++ )
    {
      for ( j = 0; j < m_cv_count[1] && rc; j++ )
      {
        GetCV( i, j, cv );
        d = pln.DistanceTo(cv);
        if ( fabs(d) > tolerance )
          rc = false;
      }
    }

    if ( rc && plane )
      *plane = pln;
  }

  return rc;
}